

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O0

void TranslateVariableDefinition(ExpressionTranslateContext *ctx,ExprVariableDefinition *expression)

{
  VariableData *variable_00;
  TypeBase *node;
  bool bVar1;
  ExprBlock *pEVar2;
  byte local_42;
  bool local_41;
  ExprBase *local_40;
  ExprBase *curr;
  ExprBlock *blockInitializer;
  bool zeroInitialize;
  TypeBase *type;
  VariableData *variable;
  ExprVariableDefinition *expression_local;
  ExpressionTranslateContext *ctx_local;
  
  variable_00 = expression->variable->variable;
  Print(ctx,"/* Definition of variable \'%.*s\' */",
        (ulong)(uint)((int)(variable_00->name->name).end - (int)(variable_00->name->name).begin),
        (variable_00->name->name).begin);
  node = variable_00->type;
  if (expression->initializer == (ExprBase *)0x0) {
    if ((((variable_00->isVmAlloca & 1U) == 0) && ((variable_00->lookupOnly & 1U) == 0)) &&
       (variable_00->scope->ownerNamespace == (NamespaceData *)0x0)) {
      bVar1 = isType<TypeVoid>(node);
      if (bVar1) {
        Print(ctx,"0");
      }
      else {
        bVar1 = isType<TypeBool>(node);
        if (bVar1) {
          TranslateVariableName(ctx,variable_00);
          Print(ctx," = false");
        }
        else {
          bVar1 = isType<TypeChar>(node);
          if ((((bVar1) || (bVar1 = isType<TypeShort>(node), bVar1)) ||
              ((bVar1 = isType<TypeInt>(node), bVar1 ||
               ((bVar1 = isType<TypeLong>(node), bVar1 || (bVar1 = isType<TypeTypeID>(node), bVar1))
               )))) || ((bVar1 = isType<TypeFunctionID>(node), bVar1 ||
                        ((bVar1 = isType<TypeNullptr>(node), bVar1 ||
                         (bVar1 = isType<TypeRef>(node), bVar1)))))) {
            TranslateVariableName(ctx,variable_00);
            Print(ctx," = 0");
          }
          else {
            bVar1 = isType<TypeFloat>(node);
            if (bVar1) {
              TranslateVariableName(ctx,variable_00);
              Print(ctx," = 0.0f");
            }
            else {
              bVar1 = isType<TypeDouble>(node);
              if (bVar1) {
                TranslateVariableName(ctx,variable_00);
                Print(ctx," = 0.0");
              }
              else {
                bVar1 = isType<TypeAutoRef>(node);
                if (((((!bVar1) && (bVar1 = isType<TypeAutoArray>(node), !bVar1)) &&
                     (bVar1 = isType<TypeArray>(node), !bVar1)) &&
                    ((bVar1 = isType<TypeUnsizedArray>(node), !bVar1 &&
                     (bVar1 = isType<TypeFunction>(node), !bVar1)))) &&
                   ((bVar1 = isType<TypeClass>(node), !bVar1 &&
                    (bVar1 = isType<TypeEnum>(node), !bVar1)))) {
                  __assert_fail("!\"unknown type\"",
                                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTranslate.cpp"
                                ,0x4aa,
                                "void TranslateVariableDefinition(ExpressionTranslateContext &, ExprVariableDefinition *)"
                               );
                }
                Print(ctx,"memset(&");
                TranslateVariableName(ctx,variable_00);
                Print(ctx,", 0, sizeof(");
                TranslateVariableName(ctx,variable_00);
                Print(ctx,"))");
              }
            }
          }
        }
      }
    }
    else {
      Print(ctx,"0");
    }
  }
  else {
    local_41 = false;
    if (((variable_00->isVmAlloca & 1U) == 0) &&
       (local_41 = false, (variable_00->lookupOnly & 1U) == 0)) {
      local_41 = isType<TypeClass>(node);
    }
    if (local_41 != false) {
      local_42 = 1;
      if ((variable_00->isVmAlloca & 1U) == 0) {
        local_42 = variable_00->lookupOnly;
      }
      if (((local_42 ^ 0xff) & 1) == 0) {
        __assert_fail("!(variable->isVmAlloca || variable->lookupOnly)",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTranslate.cpp"
                      ,0x458,
                      "void TranslateVariableDefinition(ExpressionTranslateContext &, ExprVariableDefinition *)"
                     );
      }
      Print(ctx,"(memset(&");
      TranslateVariableName(ctx,variable_00);
      Print(ctx,", 0, sizeof(");
      TranslateVariableName(ctx,variable_00);
      Print(ctx,")), ");
    }
    pEVar2 = getType<ExprBlock>(expression->initializer);
    if (pEVar2 == (ExprBlock *)0x0) {
      Translate(ctx,expression->initializer);
    }
    else {
      Print(ctx,"(");
      PrintLine(ctx);
      ctx->depth = ctx->depth + 1;
      for (local_40 = (pEVar2->expressions).head; local_40 != (ExprBase *)0x0;
          local_40 = local_40->next) {
        PrintIndent(ctx);
        Translate(ctx,local_40);
        if (local_40->next != (ExprBase *)0x0) {
          Print(ctx,",");
        }
        PrintLine(ctx);
      }
      ctx->depth = ctx->depth - 1;
      PrintIndent(ctx);
      Print(ctx,")");
    }
    if (local_41 != false) {
      Print(ctx,")");
    }
  }
  return;
}

Assistant:

void TranslateVariableDefinition(ExpressionTranslateContext &ctx, ExprVariableDefinition *expression)
{
	VariableData *variable = expression->variable->variable;

	Print(ctx, "/* Definition of variable '%.*s' */", FMT_ISTR(variable->name->name));

	TypeBase *type = variable->type;

	if(expression->initializer)
	{
		// Zero-initialize classes beforehand (if they are stored in a real local)
		bool zeroInitialize = !(variable->isVmAlloca || variable->lookupOnly) && isType<TypeClass>(type);

		if(zeroInitialize)
		{
			assert(!(variable->isVmAlloca || variable->lookupOnly));

			Print(ctx, "(memset(&");
			TranslateVariableName(ctx, variable);
			Print(ctx, ", 0, sizeof(");
			TranslateVariableName(ctx, variable);
			Print(ctx, ")), ");
		}

		if(ExprBlock *blockInitializer = getType<ExprBlock>(expression->initializer))
		{
			// Translate block initializer as a sequence
			Print(ctx, "(");
			PrintLine(ctx);

			ctx.depth++;

			for(ExprBase *curr = blockInitializer->expressions.head; curr; curr = curr->next)
			{
				PrintIndent(ctx);

				Translate(ctx, curr);

				if(curr->next)
					Print(ctx, ",");

				PrintLine(ctx);
			}

			ctx.depth--;

			PrintIndent(ctx);
			Print(ctx, ")");
		}
		else
		{
			Translate(ctx, expression->initializer);
		}

		if(zeroInitialize)
			Print(ctx, ")");
	}
	else if(variable->isVmAlloca || variable->lookupOnly || variable->scope->ownerNamespace)
	{
		Print(ctx, "0");
	}
	else
	{
		if(isType<TypeVoid>(type))
		{
			Print(ctx, "0");
		}
		else if(isType<TypeBool>(type))
		{
			TranslateVariableName(ctx, variable);
			Print(ctx, " = false");
		}
		else if(isType<TypeChar>(type) || isType<TypeShort>(type) || isType<TypeInt>(type) || isType<TypeLong>(type) || isType<TypeTypeID>(type) || isType<TypeFunctionID>(type) || isType<TypeNullptr>(type) || isType<TypeRef>(type))
		{
			TranslateVariableName(ctx, variable);
			Print(ctx, " = 0");
		}
		else if(isType<TypeFloat>(type))
		{
			TranslateVariableName(ctx, variable);
			Print(ctx, " = 0.0f");
		}
		else if(isType<TypeDouble>(type))
		{
			TranslateVariableName(ctx, variable);
			Print(ctx, " = 0.0");
		}
		else if(isType<TypeAutoRef>(type) || isType<TypeAutoArray>(type) || isType<TypeArray>(type) || isType<TypeUnsizedArray>(type) || isType<TypeFunction>(type) || isType<TypeClass>(type) || isType<TypeEnum>(type))
		{
			Print(ctx, "memset(&");
			TranslateVariableName(ctx, variable);
			Print(ctx, ", 0, sizeof(");
			TranslateVariableName(ctx, variable);
			Print(ctx, "))");
		}
		else
		{
			assert(!"unknown type");
		}
	}
}